

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_tailcall(HSQUIRRELVM v,SQInteger nparams)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQInteger stackbase;
  SQClosure *clo;
  SQObjectPtr *res;
  SQChar *in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQRESULT local_8;
  
  pSVar2 = SQVM::GetUp(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  if ((pSVar2->super_SQObject)._type == OT_CLOSURE) {
    if ((((pSVar2->super_SQObject)._unVal.pClosure)->_function->_bgenerator & 1U) == 0) {
      bVar1 = SQVM::TailCall(v,(SQClosure *)nparams,(SQInteger)res,(SQInteger)clo);
      if (bVar1) {
        local_8 = -0x309;
      }
      else {
        local_8 = -1;
      }
    }
    else {
      local_8 = sq_throwerror(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_tailcall(HSQUIRRELVM v, SQInteger nparams)
{
	SQObjectPtr &res = v->GetUp(-(nparams + 1));
	if (sq_type(res) != OT_CLOSURE) {
		return sq_throwerror(v, _SC("only closure can be tail called"));
	}
	SQClosure *clo = _closure(res);
	if (clo->_function->_bgenerator)
	{
		return sq_throwerror(v, _SC("generators cannot be tail called"));
	}
	
	SQInteger stackbase = (v->_top - nparams) - v->_stackbase;
	if (!v->TailCall(clo, stackbase, nparams)) {
		return SQ_ERROR;
	}
	return SQ_TAILCALL_FLAG;
}